

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

Cpu * __thiscall Cpu::lookup_abi_cxx11_(Cpu *this,unsigned_short opc)

{
  ostream *poVar1;
  ushort in_DX;
  undefined6 in_register_00000032;
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [36];
  uint local_554;
  string local_550 [4];
  int bit_3;
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [36];
  uint local_44c;
  string local_448 [4];
  int bit_2;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [36];
  uint local_2a4;
  string local_2a0 [4];
  int bit_1;
  string local_280 [32];
  string local_260 [36];
  uint local_23c;
  string local_238 [4];
  int bit;
  string local_218 [32];
  string local_1f8 [32];
  undefined4 local_1d8;
  allocator local_1d3;
  ushort local_1d2;
  ostringstream local_1d0 [6];
  unsigned_short mne;
  ostringstream outs;
  allocator local_41;
  string local_40 [8];
  string op;
  unsigned_short opc_local;
  Cpu *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  if (in_DX == 0xfff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"unused",&local_1d3);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d3);
  }
  else {
    local_1d2 = in_DX;
    if ((int)(uint)in_DX >> 9 == 5) {
      poVar1 = std::operator<<((ostream *)local_1d0,"jmp ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      std::ostream::operator<<(poVar1,local_1d2 & 0x1ff);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_40,local_1f8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::string((string *)this,local_40);
    }
    else {
      if ((int)(uint)in_DX >> 8 == 0xc) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, #");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,(uint)(byte)local_1d2);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_218);
        std::__cxx11::string::~string(local_218);
      }
      else if ((int)(uint)in_DX >> 5 == 1) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,", w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_238);
        std::__cxx11::string::~string(local_238);
      }
      else if ((int)(uint)in_DX >> 8 == 5) {
        local_23c = in_DX >> 5 & 7;
        poVar1 = std::operator<<((ostream *)local_1d0,"setb ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        poVar1 = std::operator<<(poVar1,".");
        std::ostream::operator<<(poVar1,local_23c);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_260);
        std::__cxx11::string::~string(local_260);
      }
      else if ((int)(uint)in_DX >> 5 == 0xf) {
        poVar1 = std::operator<<((ostream *)local_1d0,"add ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,", w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_280);
        std::__cxx11::string::~string(local_280);
      }
      else if ((int)(uint)in_DX >> 5 == 0xe) {
        poVar1 = std::operator<<((ostream *)local_1d0,"add w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_2a0);
        std::__cxx11::string::~string(local_2a0);
      }
      else if ((int)(uint)in_DX >> 8 == 6) {
        local_2a4 = in_DX >> 5 & 7;
        poVar1 = std::operator<<((ostream *)local_1d0,"snb ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        poVar1 = std::operator<<(poVar1,".");
        std::ostream::operator<<(poVar1,local_2a4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_2c8);
        std::__cxx11::string::~string(local_2c8);
      }
      else if ((int)(uint)in_DX >> 5 == 0xb) {
        poVar1 = std::operator<<((ostream *)local_1d0,"and ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,", w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_2e8);
        std::__cxx11::string::~string(local_2e8);
      }
      else if ((int)(uint)in_DX >> 5 == 10) {
        poVar1 = std::operator<<((ostream *)local_1d0,"and w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_308);
        std::__cxx11::string::~string(local_308);
      }
      else if ((int)(uint)in_DX >> 8 == 0xe) {
        poVar1 = std::operator<<((ostream *)local_1d0,"and w, #");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,(uint)(byte)local_1d2);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_328);
        std::__cxx11::string::~string(local_328);
      }
      else if ((int)(uint)in_DX >> 5 == 0x13) {
        poVar1 = std::operator<<((ostream *)local_1d0,"not ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_348);
        std::__cxx11::string::~string(local_348);
      }
      else if ((int)(uint)in_DX >> 5 == 9) {
        poVar1 = std::operator<<((ostream *)local_1d0,"or ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,", w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_368);
        std::__cxx11::string::~string(local_368);
      }
      else if ((int)(uint)in_DX >> 8 == 0xd) {
        poVar1 = std::operator<<((ostream *)local_1d0,"or w, #");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,(uint)(byte)local_1d2);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_388);
        std::__cxx11::string::~string(local_388);
      }
      else if ((int)(uint)in_DX >> 5 == 8) {
        poVar1 = std::operator<<((ostream *)local_1d0,"or w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_3a8);
        std::__cxx11::string::~string(local_3a8);
      }
      else if ((int)(uint)in_DX >> 5 == 0xd) {
        poVar1 = std::operator<<((ostream *)local_1d0,"xor ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,", w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_3c8);
        std::__cxx11::string::~string(local_3c8);
      }
      else if ((int)(uint)in_DX >> 5 == 0xc) {
        poVar1 = std::operator<<((ostream *)local_1d0,"xor w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_3e8);
        std::__cxx11::string::~string(local_3e8);
      }
      else if ((int)(uint)in_DX >> 8 == 0xf) {
        poVar1 = std::operator<<((ostream *)local_1d0,"xor w, #");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,(uint)(byte)local_1d2);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_408);
        std::__cxx11::string::~string(local_408);
      }
      else if ((int)(uint)in_DX >> 5 == 3) {
        poVar1 = std::operator<<((ostream *)local_1d0,"clr ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_428);
        std::__cxx11::string::~string(local_428);
      }
      else if (in_DX == 0x40) {
        std::__cxx11::string::operator=(local_40,"clr w");
      }
      else if (in_DX == 4) {
        std::__cxx11::string::operator=(local_40,"clr !WDT");
      }
      else if ((int)(uint)in_DX >> 5 == 7) {
        poVar1 = std::operator<<((ostream *)local_1d0,"dec ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_448);
        std::__cxx11::string::~string(local_448);
      }
      else if ((int)(uint)in_DX >> 8 == 7) {
        local_44c = in_DX >> 5 & 7;
        poVar1 = std::operator<<((ostream *)local_1d0,"sb ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        poVar1 = std::operator<<(poVar1,".");
        std::ostream::operator<<(poVar1,local_44c);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_470);
        std::__cxx11::string::~string(local_470);
      }
      else if ((int)(uint)in_DX >> 5 == 0x17) {
        poVar1 = std::operator<<((ostream *)local_1d0,"decsz ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_490);
        std::__cxx11::string::~string(local_490);
      }
      else if ((int)(uint)in_DX >> 5 == 0x15) {
        poVar1 = std::operator<<((ostream *)local_1d0,"inc ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_4b0);
        std::__cxx11::string::~string(local_4b0);
      }
      else if ((int)(uint)in_DX >> 5 == 0x1f) {
        poVar1 = std::operator<<((ostream *)local_1d0,"incsz ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_4d0);
        std::__cxx11::string::~string(local_4d0);
      }
      else if ((int)(uint)in_DX >> 5 == 0x1b) {
        poVar1 = std::operator<<((ostream *)local_1d0,"RL ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_4f0);
        std::__cxx11::string::~string(local_4f0);
      }
      else if ((int)(uint)in_DX >> 5 == 0x19) {
        poVar1 = std::operator<<((ostream *)local_1d0,"RR ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_510);
        std::__cxx11::string::~string(local_510);
      }
      else if ((int)(uint)in_DX >> 5 == 5) {
        poVar1 = std::operator<<((ostream *)local_1d0,"sub ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1," w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_530);
        std::__cxx11::string::~string(local_530);
      }
      else if ((int)(uint)in_DX >> 5 == 0x1d) {
        poVar1 = std::operator<<((ostream *)local_1d0,"swap ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_550);
        std::__cxx11::string::~string(local_550);
      }
      else if ((int)(uint)in_DX >> 8 == 4) {
        local_554 = in_DX >> 5 & 7;
        poVar1 = std::operator<<((ostream *)local_1d0,"clrb ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        poVar1 = std::operator<<(poVar1,".");
        std::ostream::operator<<(poVar1,local_554);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_578);
        std::__cxx11::string::~string(local_578);
      }
      else if ((int)(uint)in_DX >> 5 == 0x10) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_598);
        std::__cxx11::string::~string(local_598);
      }
      else if ((int)(uint)in_DX >> 5 == 4) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::operator<<(poVar1,"-w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_5b8);
        std::__cxx11::string::~string(local_5b8);
      }
      else if ((int)(uint)in_DX >> 5 == 0x12) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, /");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_5d8);
        std::__cxx11::string::~string(local_5d8);
      }
      else if ((int)(uint)in_DX >> 5 == 6) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, --");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_5f8);
        std::__cxx11::string::~string(local_5f8);
      }
      else if ((int)(uint)in_DX >> 5 == 0x14) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, ++");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_618);
        std::__cxx11::string::~string(local_618);
      }
      else if ((int)(uint)in_DX >> 5 == 0x1a) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, <<");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_638);
        std::__cxx11::string::~string(local_638);
      }
      else if ((int)(uint)in_DX >> 5 == 0x18) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, <<");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_658);
        std::__cxx11::string::~string(local_658);
      }
      else if (in_DX == 0x43) {
        std::operator<<((ostream *)local_1d0,"mov m, w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_678);
        std::__cxx11::string::~string(local_678);
      }
      else if (in_DX == 0x42) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov w, m");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_698);
        std::__cxx11::string::~string(local_698);
      }
      else if ((int)(uint)in_DX >> 5 == 0x16) {
        poVar1 = std::operator<<((ostream *)local_1d0,"movsz w, --");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_6b8);
        std::__cxx11::string::~string(local_6b8);
      }
      else if ((int)(uint)in_DX >> 5 == 0x1e) {
        poVar1 = std::operator<<((ostream *)local_1d0,"movsz w, ++");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_6d8);
        std::__cxx11::string::~string(local_6d8);
      }
      else if (in_DX == 0x43) {
        std::operator<<((ostream *)local_1d0,"mov m, w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_6f8);
        std::__cxx11::string::~string(local_6f8);
      }
      else if ((int)(uint)in_DX >> 4 == 5) {
        poVar1 = std::operator<<((ostream *)local_1d0,"mov m, #");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
        std::ostream::operator<<(poVar1,local_1d2 & 0xf);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_718);
        std::__cxx11::string::~string(local_718);
      }
      else if (in_DX == 2) {
        std::operator<<((ostream *)local_1d0,"mov !option, w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_738);
        std::__cxx11::string::~string(local_738);
      }
      else if ((in_DX < 5) || (9 < in_DX)) {
        if (in_DX == 2) {
          std::operator<<((ostream *)local_1d0,"not impl: mov !option, w");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_778);
          std::__cxx11::string::~string(local_778);
        }
        else if ((int)(uint)in_DX >> 5 == 0x11) {
          poVar1 = std::operator<<((ostream *)local_1d0,"test ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<(poVar1,local_1d2 & 0x1f);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_798);
          std::__cxx11::string::~string(local_798);
        }
        else if (in_DX == 0) {
          std::operator<<((ostream *)local_1d0,"nop");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_7b8);
          std::__cxx11::string::~string(local_7b8);
        }
        else if ((int)(uint)in_DX >> 8 == 9) {
          poVar1 = std::operator<<((ostream *)local_1d0,"call ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<
                    (poVar1,(**(byte **)(CONCAT62(in_register_00000032,opc) + 0x22120) & 0xffffffe0)
                            << 4 | (uint)(byte)local_1d2);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_7d8);
          std::__cxx11::string::~string(local_7d8);
        }
        else if (in_DX == 0xc) {
          std::operator<<((ostream *)local_1d0,"ret");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_7f8);
          std::__cxx11::string::~string(local_7f8);
        }
        else if (in_DX == 0xd) {
          std::operator<<((ostream *)local_1d0,"retp");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_818);
          std::__cxx11::string::~string(local_818);
        }
        else if ((int)(uint)in_DX >> 3 == 3) {
          poVar1 = std::operator<<((ostream *)local_1d0,"bank ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<(poVar1,local_1d2 & 7);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_838);
          std::__cxx11::string::~string(local_838);
        }
        else if ((int)(uint)in_DX >> 3 == 2) {
          poVar1 = std::operator<<((ostream *)local_1d0,"page ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<(poVar1,local_1d2 & 7);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_858);
          std::__cxx11::string::~string(local_858);
        }
        else if (in_DX == 0x41) {
          std::operator<<((ostream *)local_1d0,"IREAD");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_878);
          std::__cxx11::string::~string(local_878);
        }
        else if (in_DX == 0xe) {
          std::operator<<((ostream *)local_1d0,"not impl: reti");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_898);
          std::__cxx11::string::~string(local_898);
        }
        else if (in_DX == 0xf) {
          std::operator<<((ostream *)local_1d0,"not impl: retiw");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_8b8);
          std::__cxx11::string::~string(local_8b8);
        }
        else if ((int)(uint)in_DX >> 8 == 8) {
          poVar1 = std::operator<<((ostream *)local_1d0,"retw ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<(poVar1,(uint)(byte)local_1d2);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_8d8);
          std::__cxx11::string::~string(local_8d8);
        }
        else if (in_DX == 3) {
          std::operator<<((ostream *)local_1d0,"SLEEP");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_8f8);
          std::__cxx11::string::~string(local_8f8);
        }
        else {
          poVar1 = std::operator<<((ostream *)local_1d0,"not impl ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
          std::ostream::operator<<(poVar1,local_1d2);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=(local_40,local_918);
          std::__cxx11::string::~string(local_918);
        }
      }
      else {
        std::operator<<((ostream *)local_1d0,"mov !rx, w");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=(local_40,local_758);
        std::__cxx11::string::~string(local_758);
      }
      std::__cxx11::string::string((string *)this,local_40);
    }
  }
  local_1d8 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string Cpu::lookup(USHORT opc)
{
	string
	op = "";
	ostringstream outs;
	USHORT
	mne = opc;
	if (mne == 0xfff)
		return "unused";

	if (mne >> 9 == 0x5)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xc)
	{				//mov w,lit
		outs << "mov w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 1)
	{				//mov fr,w
		outs << "mov " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 8 == 5)
	{				//setb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "setb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0xf)
	{				//add fr,w
		outs << "add " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 0xe)
	{				//add w,fr

		outs << "add w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 6)
	{				//snb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "snb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 11)
	{				//and fr,w
		outs << "and " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 10)
	{				//and w,fr
		outs << "and w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 0xe)
	{				//and w,#lit
		outs << "and w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 0x13)
	{				//not fr
		outs << "not " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 9)
	{				//or fr,w
		outs << "or " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 8 == 0xd)
	{				//or w,#lit
		outs << "or w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 8)
	{				//or w,fr
		outs << "or w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 13)
	{				//xor fr,w
		outs << "xor " << hex << (mne & 0x1f) << ", w";
		op = outs.str();

	}
	else if (mne >> 5 == 12)
	{				//xor w,fr
		outs << "xor w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 0xf)
	{				//xor w,#lit
		outs << "xor w, #" << hex << (mne & 0xff);
		op = outs.str();

	}
	else if (mne >> 5 == 3)
	{				//clr fr
		outs << "clr " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x40)
	{				//clr w
		op = "clr w";
	}
	else if (mne == 4)
	{				//clr !WDT
		op = "clr !WDT";
	}
	else if (mne >> 5 == 7)
	{				//dec fr
		outs << "dec " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 7)
	{				//sb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "sb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0x17)
	{				//decsz fr
		outs << "decsz " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x15)
	{				//inc fr
		outs << "inc " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1f)
	{				//incsz fr
		outs << "incsz " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1b)
	{				//RL fr

		outs << "RL " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x19)
	{				//RR fr
		outs << "RR " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 5)
	{				//sub fr,w
		outs << "sub " << hex << (mne & 0x1f) << " w";
		op = outs.str();

	}
	else if (mne >> 5 == 0x1d)
	{				//swap fr
		outs << "swap " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 8 == 4)
	{				//clrb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "clrb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0x10)
	{				//mov w,fr
		outs << "mov w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x4)
	{				//mov w,fr-w
		outs << "mov w, " << hex << (mne & 0x1f) << "-w";
		op = outs.str();

	}
	else if (mne >> 5 == 0x12)
	{				//mov w,/fr (complement)
		outs << "mov w, /" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x6)
	{				//mov w,--fr
		outs << "mov w, --" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x14)
	{				//mov w,++fr
		outs << "mov w, ++" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1a)
	{				//mov w,<<fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x18)
	{				//mov w,>>fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x43)
	{				//TODO: mov m,w
		outs << "mov m, w" ;
		op = outs.str();

	}
	else if (mne == 0x42)
	{				//TODO: mov w,m
		outs << "mov w, m" << hex << (mne & 0x1f);
		op = outs.str();

	}

	else if (mne >> 5 == 0x16)
	{				//movsz w,--fr
		outs << "movsz w, --" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 0x1e)
	{				//movsz w,++fr
		outs << "movsz w, ++" << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0x43)
	{ //mov m,w
		outs << "mov m, w";
		op = outs.str();

	}
	else if (mne >> 4 == 0x5)
	{ //mov m,#lit
		outs << "mov m, #" << hex << (mne&0xf);
		op = outs.str();

	}
	else if (mne == 0x2)
	{ //mov !option,w
		outs << "mov !option, w";
		op = outs.str();

	}
	else if (mne > 4 && mne < 10)
	{
		outs << "mov !rx, w";
		op = outs.str();

	}
	else if (mne == 2)
	{ //mov !option,w
		outs << "not impl: mov !option, w";
		op = outs.str();

	}

	else if (mne >> 5 == 0x11)
	{				//test fr
		outs << "test " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne == 0)
	{				//nop
		outs << "nop";
		op = outs.str();

	}
	else if (mne >> 8 == 9)
	{ //call addr8
		outs << "call " << hex << ((*status & 0xe0) << 4 | mne & 0xff);
		op = outs.str();

	}
	else if (mne == 0xc)
	{ //ret
		outs << "ret";
		op = outs.str();
	}
	else if (mne == 0xd)
	{ //retp
		outs << "retp";
		op = outs.str();

	}
	else if (mne >> 3 == 3)
	{ //bank addr12
		outs << "bank " << hex << (mne&7);
		op = outs.str();

	}
	else if (mne >> 3 == 2)
	{ //page addr12
		outs << "page " << hex << (mne&7);
		op = outs.str();

	}
	else if (mne == 0x41)
	{ //IREAD
		outs << "IREAD";
		op = outs.str();
	}
	else if (mne == 0xe)
	{ //TODO: reti
		outs << "not impl: reti";
		op = outs.str();
	}
	else if (mne == 0xf)
	{ //TODO: retiw
		outs << "not impl: retiw";
		op = outs.str();
	}
	else if (mne >> 8 == 8)
	{ //retw #lit
		outs << "retw " << hex << (mne&0xff);
		op = outs.str();
	}
	else if (mne == 3)
	{ //TODO: SLEEP
		outs << "SLEEP";
		op = outs.str();
	}



	else
	{
		outs << "not impl " << hex << mne;
		op = outs.str();
	}
	return op;

}